

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.cpp
# Opt level: O0

uint CRC::ComputeCrc32(uint polynomial,uchar *buffer,uint size)

{
  uint local_438;
  int local_434;
  uint crc;
  int b;
  uint crc_1;
  int i;
  int crc_array [256];
  uint local_1c;
  byte *pbStack_18;
  uint size_local;
  uchar *buffer_local;
  uint polynomial_local;
  
  for (b = 0; b < 0x100; b = b + 1) {
    crc = b;
    for (local_434 = 0; local_434 < 8; local_434 = local_434 + 1) {
      if ((crc & 1) == 1) {
        crc = polynomial ^ crc >> 1;
      }
      else {
        crc = crc >> 1;
      }
    }
    (&crc_1)[b] = crc;
  }
  local_438 = 0xffffffff;
  local_1c = size;
  pbStack_18 = buffer;
  while (local_1c != 0) {
    local_438 = (&crc_1)[(local_438 ^ *pbStack_18) & 0xff] ^ local_438 >> 8;
    local_1c = local_1c - 1;
    pbStack_18 = pbStack_18 + 1;
  }
  return local_438 ^ 0xffffffff;
}

Assistant:

unsigned int CRC::ComputeCrc32(unsigned int polynomial, const unsigned char* buffer, unsigned int size)
{
   // Compute the array
   int crc_array [ 256 ];

   for (int i = 0; i < 256; i++)
   {
      unsigned int crc = i;
      for (int b = 0; b < 8; b++)
      {
         if ((crc & 1) == 1)
         {
            crc = (polynomial ^ (crc >> 1));
         }
         else
         {
            crc >>= 1;
         }
      }
      crc_array[i] = crc;
   }

   unsigned int crc = ~0;

   while (size--)
   {
      crc = crc_array[(crc ^ *buffer++) & 0xff] ^ (crc >> 8);
   }
   return crc ^ ~0;
}